

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O3

void JPCommonLabel_clear(JPCommonLabel *label)

{
  _JPCommonLabelPhoneme *p_Var1;
  _JPCommonLabelMora *p_Var2;
  _JPCommonLabelWord *p_Var3;
  _JPCommonLabelAccentPhrase *p_Var4;
  _JPCommonLabelBreathGroup *p_Var5;
  JPCommonLabelPhoneme *__ptr;
  JPCommonLabelMora *__ptr_00;
  JPCommonLabelWord *__ptr_01;
  JPCommonLabelAccentPhrase *__ptr_02;
  JPCommonLabelBreathGroup *__ptr_03;
  char **__ptr_04;
  long lVar6;
  
  __ptr = label->phoneme_head;
  while (__ptr != (JPCommonLabelPhoneme *)0x0) {
    p_Var1 = __ptr->next;
    free(__ptr->phoneme);
    free(__ptr);
    __ptr = p_Var1;
  }
  __ptr_00 = label->mora_head;
  while (__ptr_00 != (JPCommonLabelMora *)0x0) {
    p_Var2 = __ptr_00->next;
    free(__ptr_00->mora);
    free(__ptr_00);
    __ptr_00 = p_Var2;
  }
  __ptr_01 = label->word_head;
  while (__ptr_01 != (JPCommonLabelWord *)0x0) {
    p_Var3 = __ptr_01->next;
    free(__ptr_01->pron);
    free(__ptr_01->pos);
    free(__ptr_01->ctype);
    free(__ptr_01->cform);
    free(__ptr_01);
    __ptr_01 = p_Var3;
  }
  __ptr_02 = label->accent_head;
  while (__ptr_02 != (JPCommonLabelAccentPhrase *)0x0) {
    p_Var4 = __ptr_02->next;
    if (__ptr_02->emotion != (char *)0x0) {
      free(__ptr_02->emotion);
    }
    free(__ptr_02);
    __ptr_02 = p_Var4;
  }
  __ptr_03 = label->breath_head;
  while (__ptr_03 != (JPCommonLabelBreathGroup *)0x0) {
    p_Var5 = __ptr_03->next;
    free(__ptr_03);
    __ptr_03 = p_Var5;
  }
  __ptr_04 = label->feature;
  if (__ptr_04 == (char **)0x0) {
    return;
  }
  if (0 < label->size) {
    lVar6 = 0;
    do {
      free(label->feature[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < label->size);
    __ptr_04 = label->feature;
  }
  free(__ptr_04);
  return;
}

Assistant:

void JPCommonLabel_clear(JPCommonLabel * label)
{
   int i;
   JPCommonLabelPhoneme *p, *pn;
   JPCommonLabelMora *m, *mn;
   JPCommonLabelWord *w, *wn;
   JPCommonLabelAccentPhrase *a, *an;
   JPCommonLabelBreathGroup *b, *bn;

   for (p = label->phoneme_head; p != NULL; p = pn) {
      pn = p->next;
      JPCommonLabelPhoneme_clear(p);
      free(p);
   }
   for (m = label->mora_head; m != NULL; m = mn) {
      mn = m->next;
      JPCommonLabelMora_clear(m);
      free(m);
   }
   for (w = label->word_head; w != NULL; w = wn) {
      wn = w->next;
      JPCommonLabelWord_clear(w);
      free(w);
   }
   for (a = label->accent_head; a != NULL; a = an) {
      an = a->next;
      JPCommonLabelAccentPhrase_clear(a);
      free(a);
   }
   for (b = label->breath_head; b != NULL; b = bn) {
      bn = b->next;
      JPCommonLabelBreathGroup_clear(b);
      free(b);
   }
   if (label->feature != NULL) {
      for (i = 0; i < label->size; i++)
         free(label->feature[i]);
      free(label->feature);
   }
}